

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O1

ER __thiscall
slang::ast::PatternCaseStatement::evalImpl(PatternCaseStatement *this,EvalContext *context)

{
  size_t sVar1;
  pointer pIVar2;
  long lVar3;
  bool bVar4;
  ER EVar5;
  Diagnostic *pDVar6;
  char *pcVar7;
  long lVar8;
  char cVar9;
  string_view arg;
  SourceRange range;
  ConstantValue cv;
  ConstantValue val;
  Statement *local_d0;
  SourceLocation local_c8;
  SourceLocation local_c0;
  anon_class_8_1_8991fb9c_conflict local_b0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  Expression::eval((ConstantValue *)&local_a8,this->expr,context);
  if (local_a8._M_index == '\0') {
    EVar5 = Fail;
  }
  else {
    sVar1 = (this->items)._M_extent._M_extent_value;
    if (sVar1 == 0) {
      bVar4 = true;
      local_d0 = (Statement *)0x0;
    }
    else {
      pIVar2 = (this->items)._M_ptr;
      lVar8 = 0;
      local_d0 = (Statement *)0x0;
      local_c0 = (SourceLocation)0x0;
      local_c8 = (SourceLocation)0x0;
      do {
        Pattern::eval((ConstantValue *)&local_80,*(Pattern **)((long)&(pIVar2->pattern).ptr + lVar8)
                      ,context,(ConstantValue *)&local_a8,this->condition);
        cVar9 = '\x01';
        if (local_80._M_index != '\0') {
          bVar4 = ConstantValue::isTrue((ConstantValue *)&local_80);
          if (bVar4) {
            if (*(long *)((long)&pIVar2->filter + lVar8) != 0) {
              Expression::eval((ConstantValue *)&local_58,
                               *(Expression **)((long)&pIVar2->filter + lVar8),context);
              local_b0.this =
                   (_Move_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)&local_80;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                ::_S_vtable._M_arr[(long)(char)local_58._M_index + 1]._M_data)
                        (&local_b0,
                         (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)&local_58);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_58);
              if (local_80._M_index == '\0') goto LAB_004ec496;
              bVar4 = ConstantValue::isTrue((ConstantValue *)&local_80);
              if (!bVar4) goto LAB_004ec490;
            }
            if (local_d0 == (Statement *)0x0) {
              lVar3 = *(long *)((long)&(pIVar2->pattern).ptr + lVar8);
              local_d0 = *(Statement **)((long)&(pIVar2->stmt).ptr + lVar8);
              local_c0 = *(SourceLocation *)(lVar3 + 0x10);
              local_c8 = *(SourceLocation *)(lVar3 + 0x18);
              cVar9 = (1 < this->check - Unique) * '\x02';
            }
            else {
              pDVar6 = EvalContext::addDiag
                                 (context,(DiagCode)0x3000c,
                                  *(SourceRange *)
                                   (*(long *)((long)&(pIVar2->pattern).ptr + lVar8) + 0x10));
              pDVar6 = Diagnostic::operator<<(pDVar6,(ConstantValue *)&local_a8);
              cVar9 = '\x02';
              range.endLoc = local_c8;
              range.startLoc = local_c0;
              Diagnostic::addNote(pDVar6,(DiagCode)0xb0001,range);
            }
          }
          else {
LAB_004ec490:
            cVar9 = '\x03';
          }
        }
LAB_004ec496:
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_80);
        if ((cVar9 != '\x03') && (cVar9 != '\0')) goto LAB_004ec4fd;
        lVar8 = lVar8 + 0x18;
      } while (sVar1 * 0x18 != lVar8);
      cVar9 = '\x02';
LAB_004ec4fd:
      bVar4 = cVar9 == '\x02';
    }
    EVar5 = Fail;
    if (bVar4) {
      if (local_d0 == (Statement *)0x0) {
        local_d0 = this->defaultCase;
      }
      if (local_d0 == (Statement *)0x0) {
        EVar5 = Success;
        if ((this->check | Unique0) == Priority) {
          pDVar6 = EvalContext::addDiag(context,(DiagCode)0x13000c,this->expr->sourceRange);
          bVar4 = this->check == Priority;
          pcVar7 = "unique";
          if (bVar4) {
            pcVar7 = "priority";
          }
          arg._M_str = pcVar7;
          arg._M_len = (ulong)bVar4 * 2 + 6;
          Diagnostic::operator<<(pDVar6,arg);
          Diagnostic::operator<<(pDVar6,(ConstantValue *)&local_a8);
        }
      }
      else {
        EVar5 = Statement::eval(local_d0,context);
      }
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_a8);
  return EVar5;
}

Assistant:

ER PatternCaseStatement::evalImpl(EvalContext& context) const {
    auto cv = expr.eval(context);
    if (!cv)
        return ER::Fail;

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;

    for (auto& item : items) {
        auto val = item.pattern->eval(context, cv, condition);
        if (!val)
            return ER::Fail;

        if (!val.isTrue())
            continue;

        if (item.filter) {
            val = item.filter->eval(context);
            if (!val)
                return ER::Fail;

            if (!val.isTrue())
                continue;
        }

        // If we already matched with a previous item, the only we reason
        // we'd still get here is to check for uniqueness. The presence of
        // another match means we failed the uniqueness check.
        if (matchedStmt) {
            auto& diag =
                context.addDiag(diag::ConstEvalCaseItemsNotUnique, item.pattern->sourceRange) << cv;
            diag.addNote(diag::NotePreviousMatch, matchRange);
            break;
        }

        matchedStmt = item.stmt;
        matchRange = item.pattern->sourceRange;

        if (check != UniquePriorityCheck::Unique && check != UniquePriorityCheck::Unique0)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (matchedStmt)
        return matchedStmt->eval(context);

    if (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique) {
        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return ER::Success;
}